

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist_tests.cpp
# Opt level: O0

void __thiscall
skiplist_tests::findearliestatleast_test::test_method(findearliestatleast_test *this)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  int64_t iVar6;
  long lVar7;
  uint *puVar8;
  long in_FS_OFFSET;
  CBlockIndex *ret;
  int64_t test_time;
  int r_1;
  uint i_2;
  uint i_1;
  int r;
  int64_t medianTimePast;
  uint i;
  CChain chain;
  uint curTimeMax;
  vector<CBlockIndex,_std::allocator<CBlockIndex>_> vBlocksMain;
  vector<uint256,_std::allocator<uint256>_> vHashMain;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *in_stack_fffffffffffffc08;
  undefined4 in_stack_fffffffffffffc10;
  int in_stack_fffffffffffffc14;
  CBlockIndex *in_stack_fffffffffffffc18;
  undefined7 in_stack_fffffffffffffc20;
  undefined1 in_stack_fffffffffffffc27;
  CBlockIndex *in_stack_fffffffffffffc28;
  CBlockIndex *in_stack_fffffffffffffc30;
  vector<CBlockIndex,_std::allocator<CBlockIndex>_> *in_stack_fffffffffffffc38;
  undefined7 in_stack_fffffffffffffc40;
  undefined1 in_stack_fffffffffffffc47;
  lazy_ostream *in_stack_fffffffffffffc48;
  int in_stack_fffffffffffffc64;
  lazy_ostream *in_stack_fffffffffffffc68;
  reference local_2f0;
  uint uVar9;
  uint local_2ac;
  uint local_2a8;
  int local_2a0;
  uint local_298;
  const_string local_280 [2];
  assertion_result local_240 [2];
  const_string local_208 [2];
  lazy_ostream local_1e8 [2];
  assertion_result local_1c8 [2];
  const_string local_190 [2];
  lazy_ostream local_170 [2];
  assertion_result local_150 [3];
  const_string local_100 [2];
  lazy_ostream local_e0 [2];
  assertion_result local_c0 [2];
  uint local_88;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<uint256>::allocator((allocator<uint256> *)in_stack_fffffffffffffc08);
  std::vector<uint256,_std::allocator<uint256>_>::vector
            ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffc38,
             (size_type)in_stack_fffffffffffffc30,(allocator_type *)in_stack_fffffffffffffc28);
  std::allocator<uint256>::~allocator((allocator<uint256> *)in_stack_fffffffffffffc08);
  std::allocator<CBlockIndex>::allocator((allocator<CBlockIndex> *)in_stack_fffffffffffffc08);
  std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::vector
            (in_stack_fffffffffffffc38,(size_type)in_stack_fffffffffffffc30,
             (allocator_type *)in_stack_fffffffffffffc28);
  std::allocator<CBlockIndex>::~allocator((allocator<CBlockIndex> *)in_stack_fffffffffffffc08);
  local_298 = 0;
  while( true ) {
    uVar2 = (ulong)local_298;
    sVar3 = std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::size
                      ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)
                       in_stack_fffffffffffffc08);
    if (sVar3 <= uVar2) break;
    arith_uint256::arith_uint256((arith_uint256 *)in_stack_fffffffffffffc08,0xae8841);
    ArithToUint256((arith_uint256 *)in_stack_fffffffffffffc18);
    pvVar4 = std::vector<uint256,_std::allocator<uint256>_>::operator[]
                       ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffc18,
                        CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
    *(undefined8 *)(pvVar4->super_base_blob<256U>).m_data._M_elems = local_28;
    *(undefined8 *)((pvVar4->super_base_blob<256U>).m_data._M_elems + 8) = local_20;
    *(undefined8 *)((pvVar4->super_base_blob<256U>).m_data._M_elems + 0x10) = local_18;
    *(undefined8 *)((pvVar4->super_base_blob<256U>).m_data._M_elems + 0x18) = local_10;
    uVar9 = local_298;
    pvVar5 = std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::operator[]
                       ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)
                        in_stack_fffffffffffffc18,
                        CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
    pvVar5->nHeight = uVar9;
    if (local_298 == 0) {
      local_2f0 = (reference)0x0;
    }
    else {
      local_2f0 = std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::operator[]
                            ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)
                             in_stack_fffffffffffffc18,
                             CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
    }
    pvVar5 = std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::operator[]
                       ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)
                        in_stack_fffffffffffffc18,
                        CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
    pvVar5->pprev = local_2f0;
    pvVar4 = std::vector<uint256,_std::allocator<uint256>_>::operator[]
                       ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffc18,
                        CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
    pvVar5 = std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::operator[]
                       ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)
                        in_stack_fffffffffffffc18,
                        CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
    pvVar5->phashBlock = pvVar4;
    std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::operator[]
              ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)in_stack_fffffffffffffc18,
               CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
    CBlockIndex::BuildSkip(in_stack_fffffffffffffc18);
    if (local_298 < 10) {
      pvVar5 = std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::operator[]
                         ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)
                          in_stack_fffffffffffffc18,
                          CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
      pvVar5->nTime = local_298;
      pvVar5 = std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::operator[]
                         ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)
                          in_stack_fffffffffffffc18,
                          CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
      pvVar5->nTimeMax = local_298;
    }
    else {
      std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::operator[]
                ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)in_stack_fffffffffffffc18,
                 CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
      iVar6 = CBlockIndex::GetMedianTimePast(in_stack_fffffffffffffc28);
      lVar7 = RandomMixin<FastRandomContext>::randrange<long>
                        ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffc30,
                         (long)in_stack_fffffffffffffc28);
      local_2a0 = (int)iVar6;
      pvVar5 = std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::operator[]
                         ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)
                          in_stack_fffffffffffffc18,
                          CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
      pvVar5->nTime = (int)lVar7 + local_2a0;
      std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::operator[]
                ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)in_stack_fffffffffffffc18,
                 CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
      std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::operator[]
                ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)in_stack_fffffffffffffc18,
                 CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
      puVar8 = std::max<unsigned_int>
                         ((uint *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                          (uint *)in_stack_fffffffffffffc08);
      uVar9 = *puVar8;
      pvVar5 = std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::operator[]
                         ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)
                          in_stack_fffffffffffffc18,
                          CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
      pvVar5->nTimeMax = uVar9;
    }
    local_298 = local_298 + 1;
  }
  local_88 = 0;
  for (local_2a8 = 0;
      sVar3 = std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::size
                        ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)
                         in_stack_fffffffffffffc08), local_2a8 < sVar3; local_2a8 = local_2a8 + 1) {
    std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::operator[]
              ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)in_stack_fffffffffffffc18,
               CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
    puVar8 = std::max<unsigned_int>
                       ((uint *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                        (uint *)in_stack_fffffffffffffc08);
    local_88 = *puVar8;
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffc18,
                 (pointer)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                 (unsigned_long)in_stack_fffffffffffffc08);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffc08);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffffc48,
                 (const_string *)CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40),
                 (size_t)in_stack_fffffffffffffc38,(const_string *)in_stack_fffffffffffffc30);
      std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::operator[]
                ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)in_stack_fffffffffffffc18,
                 CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffffc18,
                 SUB41((uint)in_stack_fffffffffffffc14 >> 0x18,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffc18,
                 (pointer)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                 (unsigned_long)in_stack_fffffffffffffc08);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                 (basic_cstring<const_char> *)in_stack_fffffffffffffc08);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffc18,
                 (pointer)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                 (unsigned_long)in_stack_fffffffffffffc08);
      in_stack_fffffffffffffc08 =
           (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
            *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_c0,local_e0,local_100,0x7f,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl(in_stack_fffffffffffffc08);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffc08);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
  }
  CChain::CChain((CChain *)in_stack_fffffffffffffc08);
  std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::back
            ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)in_stack_fffffffffffffc08);
  CChain::SetTip((CChain *)in_stack_fffffffffffffc28,
                 (CBlockIndex *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20));
  for (local_2ac = 0; local_2ac < 10000; local_2ac = local_2ac + 1) {
    std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::size
              ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)in_stack_fffffffffffffc08);
    RandomMixin<FastRandomContext>::randrange<unsigned_long>
              ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffc30,
               (unsigned_long)in_stack_fffffffffffffc28);
    std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::operator[]
              ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)in_stack_fffffffffffffc18,
               CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
    CChain::FindEarliestAtLeast
              ((CChain *)in_stack_fffffffffffffc38,(int64_t)in_stack_fffffffffffffc68,
               in_stack_fffffffffffffc64);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffc18,
                 (pointer)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                 (unsigned_long)in_stack_fffffffffffffc08);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffc08);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffffc48,
                 (const_string *)CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40),
                 (size_t)in_stack_fffffffffffffc38,(const_string *)in_stack_fffffffffffffc30);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffffc18,
                 SUB41((uint)in_stack_fffffffffffffc14 >> 0x18,0));
      in_stack_fffffffffffffc68 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffc18,
                 (pointer)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                 (unsigned_long)in_stack_fffffffffffffc08);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                 (basic_cstring<const_char> *)in_stack_fffffffffffffc08);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffc18,
                 (pointer)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                 (unsigned_long)in_stack_fffffffffffffc08);
      in_stack_fffffffffffffc08 =
           (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
            *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_150,local_170,local_190,0x8c,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl(in_stack_fffffffffffffc08);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffc08);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
      in_stack_fffffffffffffc64 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffc64);
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffc18,
                 (pointer)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                 (unsigned_long)in_stack_fffffffffffffc08);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffc08);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffffc48,
                 (const_string *)CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40),
                 (size_t)in_stack_fffffffffffffc38,(const_string *)in_stack_fffffffffffffc30);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffffc18,
                 SUB41((uint)in_stack_fffffffffffffc14 >> 0x18,0));
      in_stack_fffffffffffffc48 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffc18,
                 (pointer)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                 (unsigned_long)in_stack_fffffffffffffc08);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                 (basic_cstring<const_char> *)in_stack_fffffffffffffc08);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffc18,
                 (pointer)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                 (unsigned_long)in_stack_fffffffffffffc08);
      in_stack_fffffffffffffc08 =
           (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
            *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_1c8,local_1e8,local_208,0x8d,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl(in_stack_fffffffffffffc08);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffc08);
      in_stack_fffffffffffffc47 = boost::test_tools::tt_detail::dummy_cond();
    } while ((bool)in_stack_fffffffffffffc47);
    do {
      in_stack_fffffffffffffc38 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffc18,
                 (pointer)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                 (unsigned_long)in_stack_fffffffffffffc08);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffc08);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffffc48,
                 (const_string *)CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40),
                 (size_t)in_stack_fffffffffffffc38,(const_string *)in_stack_fffffffffffffc30);
      std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::operator[]
                ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)in_stack_fffffffffffffc18,
                 CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
      in_stack_fffffffffffffc30 =
           CBlockIndex::GetAncestor(in_stack_fffffffffffffc18,in_stack_fffffffffffffc14);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffffc18,
                 SUB41((uint)in_stack_fffffffffffffc14 >> 0x18,0));
      in_stack_fffffffffffffc28 = (CBlockIndex *)boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffc18,
                 (pointer)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                 (unsigned_long)in_stack_fffffffffffffc08);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                 (basic_cstring<const_char> *)in_stack_fffffffffffffc08);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffc18,
                 (pointer)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                 (unsigned_long)in_stack_fffffffffffffc08);
      in_stack_fffffffffffffc08 =
           (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
            *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_240,(lazy_ostream *)&stack0xfffffffffffffda0,local_280,0x8e,CHECK,CHECK_PRED)
      ;
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl(in_stack_fffffffffffffc08);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffc08);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
  }
  CChain::~CChain((CChain *)in_stack_fffffffffffffc08);
  std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::~vector
            ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)in_stack_fffffffffffffc18);
  std::vector<uint256,_std::allocator<uint256>_>::~vector
            ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffc18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(findearliestatleast_test)
{
    std::vector<uint256> vHashMain(100000);
    std::vector<CBlockIndex> vBlocksMain(100000);
    for (unsigned int i=0; i<vBlocksMain.size(); i++) {
        vHashMain[i] = ArithToUint256(i); // Set the hash equal to the height
        vBlocksMain[i].nHeight = i;
        vBlocksMain[i].pprev = i ? &vBlocksMain[i - 1] : nullptr;
        vBlocksMain[i].phashBlock = &vHashMain[i];
        vBlocksMain[i].BuildSkip();
        if (i < 10) {
            vBlocksMain[i].nTime = i;
            vBlocksMain[i].nTimeMax = i;
        } else {
            // randomly choose something in the range [MTP, MTP*2]
            int64_t medianTimePast = vBlocksMain[i].GetMedianTimePast();
            int r{int(m_rng.randrange(medianTimePast))};
            vBlocksMain[i].nTime = uint32_t(r + medianTimePast);
            vBlocksMain[i].nTimeMax = std::max(vBlocksMain[i].nTime, vBlocksMain[i-1].nTimeMax);
        }
    }
    // Check that we set nTimeMax up correctly.
    unsigned int curTimeMax = 0;
    for (unsigned int i=0; i<vBlocksMain.size(); ++i) {
        curTimeMax = std::max(curTimeMax, vBlocksMain[i].nTime);
        BOOST_CHECK(curTimeMax == vBlocksMain[i].nTimeMax);
    }

    // Build a CChain for the main branch.
    CChain chain;
    chain.SetTip(vBlocksMain.back());

    // Verify that FindEarliestAtLeast is correct.
    for (unsigned int i=0; i<10000; ++i) {
        // Pick a random element in vBlocksMain.
        int r = m_rng.randrange(vBlocksMain.size());
        int64_t test_time = vBlocksMain[r].nTime;
        CBlockIndex* ret = chain.FindEarliestAtLeast(test_time, 0);
        BOOST_CHECK(ret->nTimeMax >= test_time);
        BOOST_CHECK((ret->pprev==nullptr) || ret->pprev->nTimeMax < test_time);
        BOOST_CHECK(vBlocksMain[r].GetAncestor(ret->nHeight) == ret);
    }
}